

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_cpu_features.c
# Opt level: O1

void printJson(Node *current)

{
  ulong uVar1;
  byte *pbVar2;
  int __c;
  
  do {
    switch(current->type) {
    case NT_INT:
      printf("%d",(ulong)current->integer);
      return;
    case NT_MAP:
      putchar(0x7b);
      if (current->next != (Node *)0x0) {
        printJson(current->next);
      }
      __c = 0x7d;
      goto LAB_00102c50;
    case NT_MAP_ENTRY:
      printf("\"%s\":",current->string);
    case NT_ARRAY_ELEMENT:
      printJson(current->value);
      if (current->next == (Node *)0x0) {
switchD_00102b72_default:
        return;
      }
      putchar(0x2c);
      current = current->next;
      break;
    case NT_ARRAY:
      putchar(0x5b);
      if (current->next != (Node *)0x0) {
        printJson(current->next);
      }
      __c = 0x5d;
      goto LAB_00102c50;
    case NT_STRING:
      pbVar2 = (byte *)current->string;
      putchar(0x22);
      if (pbVar2 != (byte *)0x0) goto LAB_00102c19;
      goto LAB_00102c4b;
    default:
      goto switchD_00102b72_default;
    }
  } while( true );
LAB_00102c19:
  uVar1 = (ulong)*pbVar2;
  if (uVar1 < 0x30) {
    if ((0x800400003700U >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 == 0) {
LAB_00102c4b:
        __c = 0x22;
LAB_00102c50:
        putchar(__c);
        return;
      }
      goto LAB_00102c44;
    }
LAB_00102c28:
    putchar(0x5c);
  }
  else {
LAB_00102c44:
    if (*pbVar2 == 0x5c) goto LAB_00102c28;
  }
  putchar((int)(char)*pbVar2);
  pbVar2 = pbVar2 + 1;
  goto LAB_00102c19;
}

Assistant:

static void printJson(const Node* current) {
  assert(current);
  switch (current->type) {
    case NT_INVALID:
      break;
    case NT_INT:
      printf("%d", current->integer);
      break;
    case NT_STRING:
      printJsonString(current->string);
      break;
    case NT_ARRAY:
      putchar('[');
      if (current->next) printJson(current->next);
      putchar(']');
      break;
    case NT_MAP:
      putchar('{');
      if (current->next) printJson(current->next);
      putchar('}');
      break;
    case NT_MAP_ENTRY:
      printf("\"%s\":", current->string);
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
    case NT_ARRAY_ELEMENT:
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
  }
}